

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::FinalizeInit(Amr *this,Real strt_time,Real stop_time)

{
  int iVar1;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  ostream *poVar7;
  uint uVar8;
  int lev_2;
  ulong uVar9;
  ulong uVar10;
  int lev;
  long lVar11;
  double dVar12;
  Print local_1a0;
  
  _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (((this->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  (**(code **)(*(long *)_Var2.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x68))
            (stop_time,
             _Var2.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
             *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
             this->sub_cycle,&this->n_cycle,
             &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&this->dt_level);
  dVar12 = *(this->dt_level).super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  *(this->dt_min).super_vector<double,_std::allocator<double>_>.
   super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       dVar12;
  *(this->n_cycle).super_vector<int,_std::allocator<int>_>.
   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    bldFineLevels(this,strt_time);
  }
  uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  piVar3 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    dVar12 = dVar12 / (double)piVar3[uVar9 + 1];
    pdVar4[uVar9 + 1] = dVar12;
    pdVar5[uVar9 + 1] = dVar12;
  }
  lVar11 = 0;
  while( true ) {
    if ((int)uVar8 < lVar11) break;
    dVar12 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar11];
    (**(code **)(*(long *)(this->amr_level).
                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                + 0xc0))(strt_time,dVar12,dVar12);
    lVar11 = lVar11 + 1;
    uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  }
  for (lVar11 = 0; lVar11 <= (int)uVar8; lVar11 = lVar11 + 1) {
    strt_time = (Real)(**(code **)(*(long *)(this->amr_level).
                                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                            .
                                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
                                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0x98))(strt_time);
    uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  }
  piVar3 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->level_count).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  for (lVar11 = 0; lVar11 <= (int)uVar8; lVar11 = lVar11 + 1) {
    piVar3[lVar11] = 0;
    piVar6[lVar11] = 0;
    uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  }
  for (lVar11 = 0; lVar11 <= (int)uVar8; lVar11 = lVar11 + 1) {
    (**(code **)(*(long *)(this->amr_level).
                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                + 0xa0))(stop_time);
    uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    iVar1 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose;
    if (iVar1 < 2) {
      if (iVar1 == 1) {
        poVar7 = OutStream();
        Print::Print(&local_1a0,poVar7);
        std::operator<<((ostream *)&local_1a0.ss,"INITIAL GRIDS \n");
        Print::~Print(&local_1a0);
        poVar7 = OutStream();
        AmrCore::printGridSummary
                  (&this->super_AmrCore,poVar7,0,
                   *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
    else {
      poVar7 = OutStream();
      Print::Print(&local_1a0,poVar7);
      std::operator<<((ostream *)&local_1a0.ss,"INITIAL GRIDS \n");
      Print::~Print(&local_1a0);
      poVar7 = OutStream();
      printGridInfo(this,poVar7,0,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
  }
  if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    std::operator<<((ostream *)&this->gridlog,"INITIAL GRIDS \n");
    printGridInfo(this,(ostream *)&this->gridlog,0,
                  *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
  }
  return;
}

Assistant:

void
Amr::FinalizeInit (Real              strt_time,
                   Real              stop_time)
{
    BL_PROFILE("Amr::FinalizeInit()");
    //
    // Compute dt and set time levels of all grid data.
    //
    amr_level[0]->computeInitialDt(finest_level,
                                   sub_cycle,
                                   n_cycle,
                                   ref_ratio,
                                   dt_level,
                                   stop_time);
    //
    // The following was added for multifluid.
    //
    Real dt0   = dt_level[0];
    dt_min[0]  = dt_level[0];
    n_cycle[0] = 1;

    if (max_level > 0)
        bldFineLevels(strt_time);

    for (int lev = 1; lev <= finest_level; lev++)
    {
        dt0           /= n_cycle[lev];
        dt_level[lev]  = dt0;
        dt_min[lev]    = dt_level[lev];
    }

    for (int lev = 0; lev <= finest_level; lev++)
        amr_level[lev]->setTimeLevel(strt_time,dt_level[lev],dt_level[lev]);

    for (int lev = 0; lev <= finest_level; lev++)
        amr_level[lev]->post_regrid(0,finest_level);

    for (int lev = 0; lev <= finest_level; lev++)
    {
        level_steps[lev] = 0;
        level_count[lev] = 0;
    }

    //
    // Perform any special post_initialization operations.
    //
    for(int lev(0); lev <= finest_level; ++lev) {
      amr_level[lev]->post_init(stop_time);
    }

    if (ParallelDescriptor::IOProcessor())
    {
       if (verbose > 1)
       {
           amrex::Print() << "INITIAL GRIDS \n";
           printGridInfo(amrex::OutStream(),0,finest_level);
       }
       else if (verbose > 0)
       {
           amrex::Print() << "INITIAL GRIDS \n";
           printGridSummary(amrex::OutStream(),0,finest_level);
       }
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        gridlog << "INITIAL GRIDS \n";
        printGridInfo(gridlog,0,finest_level);
    }

    BL_COMM_PROFILE_NAMETAG("Amr::initialInit BOTTOM");
}